

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_failprob.c
# Opt level: O1

int zero_overhead_test(int K,int nTest,float loss)

{
  long lVar1;
  bool bVar2;
  RqInterProgram *__ptr;
  float loss_00;
  int iVar3;
  uint32_t *ESIs;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  undefined8 uStack_50;
  ulong local_48;
  RqInterProgram *local_40;
  RqInterProgram *program;
  
  if (nTest < 1) {
    uVar6 = 0;
  }
  else {
    local_48 = (ulong)(uint)K * 4 + 0xf & 0xfffffffffffffff0;
    uVar6 = 0;
    uVar5 = 0;
    program._0_4_ = nTest;
    program._4_4_ = loss;
    do {
      loss_00 = program._4_4_;
      lVar1 = -local_48;
      ESIs = (uint32_t *)((long)&local_48 + lVar1);
      if ((program._4_4_ != 1.0) || (NAN(program._4_4_))) {
        *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1014d6;
        get_esis_after_loss(K,ESIs,loss_00);
      }
      else {
        *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1014c9;
        get_random_esis(K,ESIs);
      }
      local_40 = (RqInterProgram *)0x0;
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1014f0;
      iVar3 = getProgram(K,K,ESIs,&local_40);
      if (iVar3 == 0) {
LAB_00101501:
        if ((int)(uVar5 / 1000) * 1000 == (int)uVar5) {
          *(undefined8 *)((long)&uStack_50 + lVar1) = 0x10152e;
          printf("   Completed test %d, nFail=%d\n",uVar5,(ulong)uVar6);
          *(undefined8 *)((long)&uStack_50 + lVar1) = 0x10153d;
          fflush(_stdout);
        }
        __ptr = local_40;
        *(undefined8 *)((long)&uStack_50 + lVar1) = 0x101546;
        free(__ptr);
        bVar2 = true;
      }
      else {
        if (iVar3 == -4) {
          uVar6 = uVar6 + 1;
          goto LAB_00101501;
        }
        bVar2 = false;
      }
      if (!bVar2) {
        return -1;
      }
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
    } while ((uint)program != uVar4);
  }
  return uVar6;
}

Assistant:

int zero_overhead_test(int K, int nTest, float loss)
{
#define RUN_NOFAIL(x) \
	do { \
		int RUN_NOFAIL_err; \
		if ((RUN_NOFAIL_err = (x)) != 0) { \
			fprintf(stderr, "Error:%s:%d:  %s failed: %d\n", \
				__FILE__, __LINE__, #x, RUN_NOFAIL_err); \
			if (config) \
				free(config); \
			return -1; \
		} \
	} while(0)

	int nFail = 0;
	for (int i = 0; i < nTest; ++i) {
		uint32_t ESIs[K];
		if (loss == 1) {
			get_random_esis(K, ESIs);
		} else {
			get_esis_after_loss(K, ESIs, loss);
		}

		/* Create the program */
		RqInterProgram* program = NULL;
		int err = getProgram(K, K, ESIs, &program);
		switch (err) {
		case 0:						break;
		case RQ_ERR_INSUFF_IDS:	++nFail;	break;
		default:
			return -1;
		};

		if (i % 1000 == 0) {
			printf("   Completed test %d, nFail=%d\n", i, nFail);
			fflush(stdout);
		}

		free(program);
	}

#undef RUN_NOFAIL
	return nFail;
}